

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

void pfx_table_notify_diff_cb(pfx_record *record,void *data)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  notify_diff_cb_args *args;
  void *data_local;
  pfx_record *record_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(rtr_socket **)((long)data + 0x10) == record->socket) &&
     ((*(byte *)((long)data + 0x20) & 1) != 0)) {
    iVar2 = pfx_table_remove(*data,record);
    if (iVar2 != 0) {
      pfx_table_notify_clients
                (*(pfx_table **)((long)data + 8),record,(_Bool)(*(byte *)((long)data + 0x20) & 1));
    }
  }
  else if ((*(rtr_socket **)((long)data + 0x10) == record->socket) &&
          ((*(byte *)((long)data + 0x20) & 1) == 0)) {
    pfx_table_notify_clients
              (*(pfx_table **)((long)data + 8),record,(_Bool)(*(byte *)((long)data + 0x20) & 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void pfx_table_notify_diff_cb(const struct pfx_record *record, void *data)
{
	struct notify_diff_cb_args *args = data;

	if (args->socket == record->socket && args->added) {
		if (pfx_table_remove(args->old_table, record) != PFX_SUCCESS)
			pfx_table_notify_clients(args->new_table, record, args->added);
	} else if (args->socket == record->socket && !args->added) {
		pfx_table_notify_clients(args->new_table, record, args->added);
	}
}